

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableNeuralNetworkValidator.cpp
# Opt level: O0

Result * validateWeightParamsUpdatable(Result *__return_storage_ptr__,NeuralNetworkLayer *layer)

{
  LayerCase LVar1;
  ConvolutionLayerParams *pCVar2;
  InnerProductLayerParams *pIVar3;
  WeightParams *pWVar4;
  string *psVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined4 local_78;
  undefined1 local_68 [8];
  string err;
  undefined1 local_40 [3];
  bool bias_is_quantized;
  bool weights_are_quantized;
  bool has_bias;
  bool bias_update_flag;
  bool weight_update_flag;
  Result r;
  NeuralNetworkLayer *layer_local;
  
  r.m_message.field_2._8_8_ = layer;
  CoreML::Result::Result((Result *)local_40);
  err.field_2._M_local_buf[0xf] = '\0';
  err.field_2._M_local_buf[0xe] = '\0';
  err.field_2._M_local_buf[0xd] = '\0';
  err.field_2._M_local_buf[0xc] = '\0';
  err.field_2._M_local_buf[0xb] = '\0';
  std::__cxx11::string::string((string *)local_68);
  LVar1 = CoreML::Specification::NeuralNetworkLayer::layer_case
                    ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
  if (LVar1 == kConvolution) {
    pCVar2 = CoreML::Specification::NeuralNetworkLayer::convolution
                       ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
    err.field_2._M_local_buf[0xd] = CoreML::Specification::ConvolutionLayerParams::hasbias(pCVar2);
    if ((bool)err.field_2._M_local_buf[0xd]) {
      pCVar2 = CoreML::Specification::NeuralNetworkLayer::convolution
                         ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
      pWVar4 = CoreML::Specification::ConvolutionLayerParams::bias(pCVar2);
      err.field_2._M_local_buf[0xe] = CoreML::Specification::WeightParams::isupdatable(pWVar4);
      pCVar2 = CoreML::Specification::NeuralNetworkLayer::convolution
                         ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
      pWVar4 = CoreML::Specification::ConvolutionLayerParams::bias(pCVar2);
      err.field_2._M_local_buf[0xb] = CoreML::Specification::WeightParams::has_quantization(pWVar4);
    }
    pCVar2 = CoreML::Specification::NeuralNetworkLayer::convolution
                       ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
    pWVar4 = CoreML::Specification::ConvolutionLayerParams::weights(pCVar2);
    err.field_2._M_local_buf[0xc] = CoreML::Specification::WeightParams::has_quantization(pWVar4);
    pCVar2 = CoreML::Specification::NeuralNetworkLayer::convolution
                       ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
    pWVar4 = CoreML::Specification::ConvolutionLayerParams::weights(pCVar2);
    err.field_2._M_local_buf[0xf] = CoreML::Specification::WeightParams::isupdatable(pWVar4);
  }
  else {
    if (LVar1 != kInnerProduct) {
      CoreML::Result::Result(__return_storage_ptr__,(Result *)local_40);
      goto LAB_009aea15;
    }
    pIVar3 = CoreML::Specification::NeuralNetworkLayer::innerproduct
                       ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
    err.field_2._M_local_buf[0xd] = CoreML::Specification::InnerProductLayerParams::hasbias(pIVar3);
    if ((bool)err.field_2._M_local_buf[0xd]) {
      pIVar3 = CoreML::Specification::NeuralNetworkLayer::innerproduct
                         ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
      pWVar4 = CoreML::Specification::InnerProductLayerParams::bias(pIVar3);
      err.field_2._M_local_buf[0xe] = CoreML::Specification::WeightParams::isupdatable(pWVar4);
      pIVar3 = CoreML::Specification::NeuralNetworkLayer::innerproduct
                         ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
      pWVar4 = CoreML::Specification::InnerProductLayerParams::bias(pIVar3);
      err.field_2._M_local_buf[0xb] = CoreML::Specification::WeightParams::has_quantization(pWVar4);
    }
    pIVar3 = CoreML::Specification::NeuralNetworkLayer::innerproduct
                       ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
    pWVar4 = CoreML::Specification::InnerProductLayerParams::weights(pIVar3);
    err.field_2._M_local_buf[0xc] = CoreML::Specification::WeightParams::has_quantization(pWVar4);
    pIVar3 = CoreML::Specification::NeuralNetworkLayer::innerproduct
                       ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
    pWVar4 = CoreML::Specification::InnerProductLayerParams::weights(pIVar3);
    err.field_2._M_local_buf[0xf] = CoreML::Specification::WeightParams::isupdatable(pWVar4);
  }
  if (((err.field_2._M_local_buf[0xc] & 1U) == 0) && ((err.field_2._M_local_buf[0xb] & 1U) == 0)) {
    if ((err.field_2._M_local_buf[0xf] == '\0') ||
       (((err.field_2._M_local_buf[0xd] & 1U) != 0 && ((err.field_2._M_local_buf[0xe] & 1U) == 0))))
    {
      psVar5 = CoreML::Specification::NeuralNetworkLayer::name_abi_cxx11_
                         ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
      std::operator+(&local_f8,"An updatable layer, named \'",psVar5);
      std::operator+(&local_d8,&local_f8,
                     "\', has a weight/bias param which is not marked as updatable.");
      std::__cxx11::string::operator=((string *)local_68,(string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_f8);
      CoreML::Result::Result
                (__return_storage_ptr__,INVALID_UPDATABLE_MODEL_PARAMETERS,(string *)local_68);
    }
    else {
      CoreML::Result::Result(__return_storage_ptr__,(Result *)local_40);
    }
  }
  else {
    psVar5 = CoreML::Specification::NeuralNetworkLayer::name_abi_cxx11_
                       ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
    std::operator+(&local_b8,"An updatable layer, named \'",psVar5);
    std::operator+(&local_98,&local_b8,
                   "\', has quantized weights/bias param. Quantized weights/bias not supported for update."
                  );
    std::__cxx11::string::operator=((string *)local_68,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    CoreML::Result::Result
              (__return_storage_ptr__,INVALID_UPDATABLE_MODEL_PARAMETERS,(string *)local_68);
  }
LAB_009aea15:
  local_78 = 1;
  std::__cxx11::string::~string((string *)local_68);
  CoreML::Result::~Result((Result *)local_40);
  return __return_storage_ptr__;
}

Assistant:

static Result validateWeightParamsUpdatable(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    
    bool weight_update_flag = false;
    bool bias_update_flag = false;
    bool has_bias = false;
    bool weights_are_quantized = false;
    bool bias_is_quantized = false;
    
    std::string err;
    
    switch (layer.layer_case()) {
        case Specification::NeuralNetworkLayer::kConvolution:
            has_bias = layer.convolution().hasbias();
            if (has_bias) {
                bias_update_flag = layer.convolution().bias().isupdatable();
                bias_is_quantized = layer.convolution().bias().has_quantization();
            }
            weights_are_quantized = layer.convolution().weights().has_quantization();
            weight_update_flag = layer.convolution().weights().isupdatable();
            break;
        case Specification::NeuralNetworkLayer::kInnerProduct:
            has_bias = layer.innerproduct().hasbias();
            if (has_bias) {
                bias_update_flag = layer.innerproduct().bias().isupdatable();
                bias_is_quantized = layer.innerproduct().bias().has_quantization();
            }
            weights_are_quantized = layer.innerproduct().weights().has_quantization();
            weight_update_flag = layer.innerproduct().weights().isupdatable();
            break;
        default:
            return r;
    }

    if (weights_are_quantized || bias_is_quantized) {
        err = "An updatable layer, named '" + layer.name() + "', has quantized weights/bias param. Quantized weights/bias not supported for update.";
        return Result(ResultType::INVALID_UPDATABLE_MODEL_PARAMETERS, err);
    }
    
    if (!weight_update_flag || ((has_bias) && (!bias_update_flag))) {
        err = "An updatable layer, named '" + layer.name() + "', has a weight/bias param which is not marked as updatable.";
        return Result(ResultType::INVALID_UPDATABLE_MODEL_PARAMETERS, err);
    }
    
    return r;
}